

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void Memory::Recycler::WBVerifyBitIsSet(char *addr,char *target)

{
  Recycler *this;
  HeapBlock *pHVar1;
  Recycler **ppRVar2;
  AutoCriticalSection local_28;
  AutoCriticalSection lock;
  
  local_28.cs = &recyclerListLock;
  CCLock::Enter(&recyclerListLock.super_CCLock);
  ppRVar2 = &recyclerList;
  do {
    this = *ppRVar2;
    if (this == (Recycler *)0x0) goto LAB_0068a662;
    pHVar1 = FindHeapBlock(this,(void *)((ulong)addr & 0xfffffffffffffff0));
    ppRVar2 = &this->next;
  } while (pHVar1 == (HeapBlock *)0x0);
  (*pHVar1->_vptr_HeapBlock[3])(pHVar1,addr);
LAB_0068a662:
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return;
}

Assistant:

void
Recycler::WBVerifyBitIsSet(char* addr, char* target)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            heapBlock->WBVerifyBitIsSet(addr);
            break;
        }
        recycler = recycler->next;
    }
}